

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O2

void __thiscall OpenMD::XYZVisitor::internalVisit(XYZVisitor *this,StuntDouble *sd)

{
  shared_ptr<OpenMD::AtomInfo> atomInfo;
  string line;
  iterator i;
  shared_ptr<OpenMD::AtomData> atomData;
  shared_ptr<OpenMD::GenericData> data;
  char buffer [1024];
  allocator<char> local_4a9;
  __shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2> local_4a8;
  undefined1 local_490 [40];
  __shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2> local_468;
  __shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2> local_458;
  undefined1 local_448 [16];
  char local_438 [1032];
  
  local_458._M_ptr = (element_type *)0x0;
  local_458._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_468._M_ptr = (element_type *)0x0;
  local_468._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_4a8._M_ptr = (element_type *)0x0;
  local_4a8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_490._32_8_ = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_490,"ATOMDATA",&local_4a9);
  StuntDouble::getPropertyByName((StuntDouble *)local_448,(string *)sd);
  std::__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_458,(__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2> *)local_448);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_448 + 8));
  std::__cxx11::string::~string((string *)local_490);
  if (local_458._M_ptr != (element_type *)0x0) {
    std::dynamic_pointer_cast<OpenMD::AtomData,OpenMD::GenericData>
              ((shared_ptr<OpenMD::GenericData> *)local_490);
    std::__shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_468,(__shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2> *)local_490);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_490 + 8));
    if (local_468._M_ptr != (element_type *)0x0) {
      AtomData::beginAtomInfo((AtomData *)local_490,(iterator *)local_468._M_ptr);
      std::__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_4a8,(__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2> *)local_490)
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_490 + 8));
      while (local_4a8._M_ptr != (element_type *)0x0) {
        local_490._0_8_ = local_490 + 0x10;
        local_490._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_490[0x10] = 0;
        snprintf(local_438,0x400,"%s",((local_4a8._M_ptr)->atomTypeName)._M_dataplus._M_p);
        std::__cxx11::string::append((char *)local_490);
        if (this->doPositions_ == true) {
          snprintf(local_438,0x400,"%15.8f%15.8f%15.8f",
                   SUB84(((local_4a8._M_ptr)->pos).super_Vector<double,_3U>.data_[0],0),
                   ((local_4a8._M_ptr)->pos).super_Vector<double,_3U>.data_[1],
                   ((local_4a8._M_ptr)->pos).super_Vector<double,_3U>.data_[2]);
          std::__cxx11::string::append((char *)local_490);
        }
        if ((this->doCharges_ == true) && ((local_4a8._M_ptr)->hasCharge == true)) {
          snprintf(local_438,0x400,"%15.8f",SUB84((local_4a8._M_ptr)->charge,0));
          std::__cxx11::string::append((char *)local_490);
        }
        if ((this->doVectors_ == true) && ((local_4a8._M_ptr)->hasVector == true)) {
          snprintf(local_438,0x400,"%15.8f%15.8f%15.8f",
                   SUB84(((local_4a8._M_ptr)->vec).super_Vector<double,_3U>.data_[0],0),
                   ((local_4a8._M_ptr)->vec).super_Vector<double,_3U>.data_[1],
                   ((local_4a8._M_ptr)->vec).super_Vector<double,_3U>.data_[2]);
          std::__cxx11::string::append((char *)local_490);
        }
        if ((this->doVelocities_ == true) && ((local_4a8._M_ptr)->hasVelocity == true)) {
          snprintf(local_438,0x400,"%15.8f%15.8f%15.8f",
                   SUB84(((local_4a8._M_ptr)->vel).super_Vector<double,_3U>.data_[0],0),
                   ((local_4a8._M_ptr)->vel).super_Vector<double,_3U>.data_[1],
                   ((local_4a8._M_ptr)->vel).super_Vector<double,_3U>.data_[2]);
          std::__cxx11::string::append((char *)local_490);
        }
        if ((this->doForces_ == true) && ((local_4a8._M_ptr)->hasForce == true)) {
          snprintf(local_438,0x400,"%15.8f%15.8f%15.8f",
                   SUB84(((local_4a8._M_ptr)->frc).super_Vector<double,_3U>.data_[0],0),
                   ((local_4a8._M_ptr)->frc).super_Vector<double,_3U>.data_[1],
                   ((local_4a8._M_ptr)->frc).super_Vector<double,_3U>.data_[2]);
          std::__cxx11::string::append((char *)local_490);
        }
        if ((this->doElectricFields_ == true) && ((local_4a8._M_ptr)->hasElectricField == true)) {
          snprintf(local_438,0x400,"%15.8f%15.8f%15.8f",
                   SUB84(((local_4a8._M_ptr)->eField).super_Vector<double,_3U>.data_[0],0),
                   ((local_4a8._M_ptr)->eField).super_Vector<double,_3U>.data_[1],
                   ((local_4a8._M_ptr)->eField).super_Vector<double,_3U>.data_[2]);
          std::__cxx11::string::append((char *)local_490);
        }
        if (this->doGlobalIDs_ == true) {
          snprintf(local_438,0x400,"%10d",(ulong)(uint)(local_4a8._M_ptr)->globalID);
          std::__cxx11::string::append((char *)local_490);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->frame,(value_type *)local_490);
        std::__cxx11::string::~string((string *)local_490);
        AtomData::nextAtomInfo((AtomData *)local_490,(iterator *)local_468._M_ptr);
        std::__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_4a8,
                   (__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2> *)local_490);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_490 + 8));
      }
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4a8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_468._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_458._M_refcount);
  return;
}

Assistant:

void XYZVisitor::internalVisit(StuntDouble* sd) {
    std::shared_ptr<GenericData> data;
    std::shared_ptr<AtomData> atomData;
    std::shared_ptr<AtomInfo> atomInfo;
    std::vector<std::shared_ptr<AtomInfo>>::iterator i;
    char buffer[1024];

    // if there is not atom data, just skip it
    data = sd->getPropertyByName("ATOMDATA");

    if (data != nullptr) {
      atomData = std::dynamic_pointer_cast<AtomData>(data);

      if (atomData == nullptr) return;
    } else
      return;

    for (atomInfo = atomData->beginAtomInfo(i); atomInfo;
         atomInfo = atomData->nextAtomInfo(i)) {
      std::string line;
      snprintf(buffer, 1024, "%s", atomInfo->atomTypeName.c_str());
      line += buffer;

      if (doPositions_) {
        snprintf(buffer, 1024, "%15.8f%15.8f%15.8f", atomInfo->pos[0],
                 atomInfo->pos[1], atomInfo->pos[2]);
        line += buffer;
      }
      if (doCharges_ && atomInfo->hasCharge) {
        snprintf(buffer, 1024, "%15.8f", atomInfo->charge);
        line += buffer;
      }
      if (doVectors_ && atomInfo->hasVector) {
        snprintf(buffer, 1024, "%15.8f%15.8f%15.8f", atomInfo->vec[0],
                 atomInfo->vec[1], atomInfo->vec[2]);
        line += buffer;
      }
      if (doVelocities_ && atomInfo->hasVelocity) {
        snprintf(buffer, 1024, "%15.8f%15.8f%15.8f", atomInfo->vel[0],
                 atomInfo->vel[1], atomInfo->vel[2]);
        line += buffer;
      }
      if (doForces_ && atomInfo->hasForce) {
        snprintf(buffer, 1024, "%15.8f%15.8f%15.8f", atomInfo->frc[0],
                 atomInfo->frc[1], atomInfo->frc[2]);
        line += buffer;
      }
      if (doElectricFields_ && atomInfo->hasElectricField) {
        snprintf(buffer, 1024, "%15.8f%15.8f%15.8f", atomInfo->eField[0],
                 atomInfo->eField[1], atomInfo->eField[2]);
        line += buffer;
      }
      if (doGlobalIDs_) {
        snprintf(buffer, 1024, "%10d", atomInfo->globalID);
        line += buffer;
      }

      frame.push_back(line);
    }
  }